

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usertimer.cpp
# Opt level: O0

time_t __thiscall soplex::UserTimer::time(UserTimer *this,time_t *__timer)

{
  Real RVar1;
  UserTimer *in_stack_00000010;
  
  if ((this->super_Timer).status == RUNNING) {
    updateTicks(in_stack_00000010);
    RVar1 = ticks2sec(this,this->uTicks + this->uAccount);
    this->lasttime = RVar1;
  }
  else {
    RVar1 = ticks2sec(this,this->uAccount);
    this->lasttime = RVar1;
  }
  return (time_t)this;
}

Assistant:

Real UserTimer::time() const
{
   if(status == RUNNING)
   {
      updateTicks();
      lasttime = ticks2sec(uTicks + uAccount);
   }
   else
   {
      lasttime = ticks2sec(uAccount);
   }

   return lasttime;
}